

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QTimeZone * __thiscall QDateTimeEditPrivate::getMaximum(QDateTimeEditPrivate *this,QTimeZone *zone)

{
  TimeSpec TVar1;
  long in_RSI;
  QTimeZone *in_RDI;
  long in_FS_OFFSET;
  QDate local_20;
  QDateTime local_18 [8];
  QDateTime local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(in_RSI + 0x3d0) >> 6 & 1) == 0) {
    TVar1 = QTimeZone::timeSpec((QTimeZone *)0x560cad);
    if (TVar1 == LocalTime) {
      QDateTimeParser::getMaximum(in_RDI);
    }
    else {
      QDate::QDate(&local_20,9999,0xc,0x1f);
      QDate::endOfDay((QTimeZone *)local_18);
      QDateTime::toTimeZone(in_RDI);
      QDateTime::~QDateTime(local_18);
    }
  }
  else {
    ::QVariant::toDateTime();
    QDateTime::toTimeZone(in_RDI);
    QDateTime::~QDateTime(local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::getMaximum(const QTimeZone &zone) const
{
    if (keyboardTracking)
        return maximum.toDateTime().toTimeZone(zone);

    // QDTP's max is the local-time end of QDATETIMEEDIT_DATE_MAX, cached
    // (along with its conversion to UTC).
    if (timeZone.timeSpec() == Qt::LocalTime)
        return QDateTimeParser::getMaximum(zone);

    return QDATETIMEEDIT_DATE_MAX.endOfDay(timeZone).toTimeZone(zone);
}